

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

BACK_COMPAT_HANDLE back_compat_init(TEST_PROTOCOL_TYPE protocol_type)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  TICK_COUNTER_HANDLE pTVar3;
  IOTHUB_ACCOUNT_INFO_HANDLE pIVar4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BACK_COMPAT_INFO *result;
  TEST_PROTOCOL_TYPE protocol_type_local;
  
  iVar1 = IoTHub_Init();
  if (iVar1 == 0) {
    l = (LOGGER_LOG)malloc(0x20);
    if (l == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"back_compat_init",0x23b,1,"Failure allocating back compat info");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      memset(l,0,0x20);
      pTVar3 = tickcounter_create();
      *(TICK_COUNTER_HANDLE *)(l + 0x10) = pTVar3;
      if (pTVar3 == (TICK_COUNTER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"back_compat_init",0x243,1,"Failure creating tickcounter object");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pIVar4 = IoTHubAccount_Init(false);
        *(IOTHUB_ACCOUNT_INFO_HANDLE *)(l + 8) = pIVar4;
        if (pIVar4 == (IOTHUB_ACCOUNT_INFO_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                      ,"back_compat_init",0x249,1,"Could not initialize IoTHubAccount");
          }
          tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0x10));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          *(TEST_PROTOCOL_TYPE *)l = protocol_type;
        }
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"back_compat_init",0x237,1,"Failure calling IoTHub_Init");
    }
  }
  return (BACK_COMPAT_HANDLE)l;
}

Assistant:

BACK_COMPAT_HANDLE back_compat_init(TEST_PROTOCOL_TYPE protocol_type)
{
    BACK_COMPAT_INFO* result;
    if (IoTHub_Init() != 0)
    {
        LogError("Failure calling IoTHub_Init");
    }
    else if ((result = (BACK_COMPAT_INFO*)malloc(sizeof(BACK_COMPAT_INFO))) == NULL)
    {
        LogError("Failure allocating back compat info");
        result = NULL;
    }
    else
    {
        memset(result, 0, sizeof(BACK_COMPAT_INFO));
        if ((result->tick_cntr_handle = tickcounter_create()) == NULL)
        {
            LogError("Failure creating tickcounter object");
            free(result);
            result = NULL;
        }
        else if ((result->acct_info = IoTHubAccount_Init(false)) == NULL)
        {
            LogError("Could not initialize IoTHubAccount");
            tickcounter_destroy(result->tick_cntr_handle);
            free(result);
            result = NULL;
        }
        else
        {
            result->protocol = protocol_type;
        }
    }
    return result;
}